

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

int mbedtls_des_setkey_dec(mbedtls_des_context *ctx,uchar *key)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  ulong uVar3;
  
  mbedtls_des_setkey(ctx->sk,key);
  puVar2 = ctx->sk + 0x1f;
  for (uVar3 = 0; uVar3 < 0x10; uVar3 = uVar3 + 2) {
    uVar1 = ctx->sk[uVar3];
    ctx->sk[uVar3] = puVar2[-1];
    puVar2[-1] = uVar1;
    uVar1 = ctx->sk[uVar3 + 1];
    ctx->sk[uVar3 + 1] = *puVar2;
    *puVar2 = uVar1;
    puVar2 = puVar2 + -2;
  }
  return 0;
}

Assistant:

int mbedtls_des_setkey_dec( mbedtls_des_context *ctx, const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    mbedtls_des_setkey( ctx->sk, key );

    for( i = 0; i < 16; i += 2 )
    {
        SWAP( ctx->sk[i    ], ctx->sk[30 - i] );
        SWAP( ctx->sk[i + 1], ctx->sk[31 - i] );
    }

    return( 0 );
}